

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O0

QUrl __thiscall
QNetworkRequestFactoryPrivate::requestUrl
          (QNetworkRequestFactoryPrivate *this,QString *path,QUrlQuery *query)

{
  bool bVar1;
  ParsingMode PVar2;
  undefined8 uVar3;
  ulong uVar4;
  type *ptVar5;
  QList<std::pair<QString,_QString>_> *this_00;
  pair<QString,_QString> *ppVar6;
  QUrlQuery *in_RCX;
  QString *in_RDX;
  long in_RSI;
  QUrlQuery *in_RDI;
  long in_FS_OFFSET;
  pair<QString,_QString> *item;
  QList<std::pair<QString,_QString>_> *__range2_1;
  type *value;
  type *key;
  QList<std::pair<QString,_QString>_> *__range2;
  QUrl *resultUrl;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  QList<std::pair<QString,_QString>_> items_1;
  const_iterator __end2;
  const_iterator __begin2;
  QList<std::pair<QString,_QString>_> items;
  QUrlQuery pathQueryItems;
  QString requestPath;
  QString basePath;
  QUrlQuery resultQuery;
  QUrlQuery providedQuery;
  QUrl providedPath;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_fffffffffffffdf8;
  ComponentFormattingOption in_stack_fffffffffffffdfc;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  undefined6 in_stack_fffffffffffffe10;
  byte bVar7;
  byte bVar8;
  QChar local_16a;
  QChar local_168;
  QChar local_166;
  QChar local_164;
  QChar local_162;
  pair<QString,_QString> *local_160;
  const_iterator local_158;
  const_iterator local_150 [2];
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  pair<QString,_QString> *local_128;
  const_iterator local_120;
  const_iterator local_118 [2];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0 [2];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_9c;
  QString local_98;
  char local_80 [40];
  undefined1 local_58 [48];
  undefined8 local_28;
  QUrl local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d = (QUrlPrivate *)0xaaaaaaaaaaaaaaaa;
  if (in_RDX == (QString *)0x0) {
    QUrl::QUrl(&local_20);
  }
  else {
    QUrl::QUrl(&local_20,in_RDX,TolerantMode);
  }
  local_28 = 0xaaaaaaaaaaaaaaaa;
  if (in_RCX == (QUrlQuery *)0x0) {
    QUrlQuery::QUrlQuery((QUrlQuery *)&local_28);
  }
  else {
    QUrlQuery::QUrlQuery((QUrlQuery *)&local_28,in_RCX);
  }
  QUrl::scheme();
  bVar1 = QString::isEmpty((QString *)0x32709d);
  bVar7 = 1;
  bVar8 = bVar7;
  if (bVar1) {
    QFlags<QUrl::ComponentFormattingOption>::QFlags
              ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffe00,
               in_stack_fffffffffffffdfc);
    QUrl::host((QFlags_conflict *)local_58);
    bVar1 = QString::isEmpty((QString *)0x3270f1);
    bVar7 = bVar1 ^ 0xff;
    bVar8 = bVar7;
    QString::~QString((QString *)0x327115);
  }
  QString::~QString((QString *)0x327122);
  if ((bVar7 & 1) != 0) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    lcQrequestfactory();
    anon_unknown.dwarf_7c5ef5::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              (in_stack_fffffffffffffe00,
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_7c5ef5::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x327185);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT17(bVar8,CONCAT16(bVar7,in_stack_fffffffffffffe10)),
                 in_stack_fffffffffffffe08,(int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                 (char *)0x32719e);
      QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
                (&local_9c,PrettyDecoded);
      QUrl::toDisplayString((QUrlTwoFlags_conflict1 *)&local_98);
      QtPrivate::asString(&local_98);
      uVar3 = QString::utf16();
      QMessageLogger::warning
                (local_80,
                 "The provided path %ls may only contain path and query item components, and other parts will be ignored. Set the baseUrl instead"
                 ,uVar3);
      QString::~QString((QString *)0x327204);
      local_10 = local_10 & 0xffffffffffffff00;
    }
  }
  *(undefined8 *)in_RDI = 0xaaaaaaaaaaaaaaaa;
  QUrl::QUrl((QUrl *)in_RDI,(QUrl *)(in_RSI + 0x10));
  local_a8 = 0xaaaaaaaaaaaaaaaa;
  QUrlQuery::QUrlQuery((QUrlQuery *)&local_a8,(QUrlQuery *)&local_28);
  local_c0 = 0xaaaaaaaaaaaaaaaa;
  local_b8 = 0xaaaaaaaaaaaaaaaa;
  local_b0 = 0xaaaaaaaaaaaaaaaa;
  QFlags<QUrl::ComponentFormattingOption>::QFlags
            ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffe00,
             in_stack_fffffffffffffdfc);
  QUrl::path((QFlags_conflict *)&local_c0);
  QUrl::setUserName((QString *)in_RDI,(int)in_RSI + 0x38);
  QUrl::setPassword((QString *)in_RDI,(int)in_RSI + 0x50);
  local_e0 = 0xaaaaaaaaaaaaaaaa;
  local_d8 = 0xaaaaaaaaaaaaaaaa;
  local_d0 = 0xaaaaaaaaaaaaaaaa;
  QFlags<QUrl::ComponentFormattingOption>::QFlags
            ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffe00,
             in_stack_fffffffffffffdfc);
  QUrl::path((QFlags_conflict *)&local_e0);
  local_f0[0] = 0xaaaaaaaaaaaaaaaa;
  QUrlQuery::QUrlQuery((QUrlQuery *)local_f0,(QUrl *)&local_20);
  uVar4 = QUrlQuery::isEmpty();
  if ((uVar4 & 1) == 0) {
    local_108 = 0xaaaaaaaaaaaaaaaa;
    local_100 = 0xaaaaaaaaaaaaaaaa;
    local_f8 = 0xaaaaaaaaaaaaaaaa;
    QFlags<QUrl::ComponentFormattingOption>::QFlags
              ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffe00,
               in_stack_fffffffffffffdfc);
    QUrlQuery::queryItems((QFlags_conflict *)&local_108);
    local_118[0].i = (pair<QString,_QString> *)0xaaaaaaaaaaaaaaaa;
    local_118[0] = QList<std::pair<QString,_QString>_>::begin
                             ((QList<std::pair<QString,_QString>_> *)in_stack_fffffffffffffe00);
    local_120.i = (pair<QString,_QString> *)0xaaaaaaaaaaaaaaaa;
    local_120 = QList<std::pair<QString,_QString>_>::end
                          ((QList<std::pair<QString,_QString>_> *)in_stack_fffffffffffffe00);
    while( true ) {
      local_128 = local_120.i;
      bVar1 = QList<std::pair<QString,_QString>_>::const_iterator::operator!=(local_118,local_120);
      if (!bVar1) break;
      QList<std::pair<QString,_QString>_>::const_iterator::operator*(local_118);
      ptVar5 = std::get<0ul,QString,QString>((pair<QString,_QString> *)0x3274a4);
      std::get<1ul,QString,QString>((pair<QString,_QString> *)0x3274c2);
      QUrlQuery::addQueryItem((QString *)&local_a8,(QString *)ptVar5);
      QList<std::pair<QString,_QString>_>::const_iterator::operator++(local_118);
    }
    QList<std::pair<QString,_QString>_>::~QList((QList<std::pair<QString,_QString>_> *)0x3274fd);
  }
  uVar4 = QUrlQuery::isEmpty();
  if ((uVar4 & 1) == 0) {
    local_140 = 0xaaaaaaaaaaaaaaaa;
    local_138 = 0xaaaaaaaaaaaaaaaa;
    local_130 = 0xaaaaaaaaaaaaaaaa;
    this_00 = (QList<std::pair<QString,_QString>_> *)(in_RSI + 0x68);
    QFlags<QUrl::ComponentFormattingOption>::QFlags
              ((QFlags<QUrl::ComponentFormattingOption> *)this_00,in_stack_fffffffffffffdfc);
    QUrlQuery::queryItems((QFlags_conflict *)&local_140);
    local_150[0].i = (pair<QString,_QString> *)0xaaaaaaaaaaaaaaaa;
    local_150[0] = QList<std::pair<QString,_QString>_>::begin(this_00);
    local_158.i = (pair<QString,_QString> *)0xaaaaaaaaaaaaaaaa;
    local_158 = QList<std::pair<QString,_QString>_>::end(this_00);
    while( true ) {
      local_160 = local_158.i;
      bVar1 = QList<std::pair<QString,_QString>_>::const_iterator::operator!=(local_150,local_158);
      if (!bVar1) break;
      ppVar6 = QList<std::pair<QString,_QString>_>::const_iterator::operator*(local_150);
      QUrlQuery::addQueryItem((QString *)&local_a8,(QString *)ppVar6);
      QList<std::pair<QString,_QString>_>::const_iterator::operator++(local_150);
    }
    QList<std::pair<QString,_QString>_>::~QList((QList<std::pair<QString,_QString>_> *)0x32765a);
  }
  uVar4 = QUrlQuery::isEmpty();
  if ((uVar4 & 1) == 0) {
    QUrl::setQuery(in_RDI);
  }
  bVar1 = QString::isEmpty((QString *)0x32768a);
  if (bVar1) goto LAB_003277da;
  QChar::QChar<char16_t,_true>(&local_162,L'/');
  uVar4 = QString::endsWith((QChar)(char16_t)&local_c0,(uint)(ushort)local_162.ucs);
  if ((uVar4 & 1) == 0) {
LAB_0032771d:
    QChar::QChar<char16_t,_true>(&local_166,L'/');
    uVar4 = QString::startsWith((QChar)(char16_t)&local_e0,(uint)(ushort)local_166.ucs);
    if ((uVar4 & 1) == 0) {
      QChar::QChar<char16_t,_true>(&local_168,L'/');
      uVar4 = QString::endsWith((QChar)(char16_t)&local_c0,(uint)(ushort)local_168.ucs);
      if ((uVar4 & 1) == 0) {
        QChar::QChar<char16_t,_true>(&local_16a,L'/');
        QString::append((QChar)(char16_t)&local_c0);
      }
    }
  }
  else {
    QChar::QChar<char16_t,_true>(&local_164,L'/');
    uVar4 = QString::startsWith((QChar)(char16_t)&local_e0,(uint)(ushort)local_164.ucs);
    if ((uVar4 & 1) == 0) goto LAB_0032771d;
    QString::chop((longlong)&local_c0);
  }
  PVar2 = QString::append((QString *)&local_c0);
  QUrl::setPath((QString *)in_RDI,PVar2);
LAB_003277da:
  QUrlQuery::~QUrlQuery((QUrlQuery *)local_f0);
  QString::~QString((QString *)0x3277f4);
  QString::~QString((QString *)0x327801);
  QUrlQuery::~QUrlQuery((QUrlQuery *)&local_a8);
  QUrlQuery::~QUrlQuery((QUrlQuery *)&local_28);
  QUrl::~QUrl(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QUrl)(QUrlPrivate *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QUrl QNetworkRequestFactoryPrivate::requestUrl(const QString *path,
                                             const QUrlQuery *query) const
{
    const QUrl providedPath = path ? QUrl(*path) : QUrl{};
    const QUrlQuery providedQuery = query ? *query : QUrlQuery();

    if (!providedPath.scheme().isEmpty() || !providedPath.host().isEmpty()) {
        qCWarning(lcQrequestfactory, "The provided path %ls may only contain path and query item "
                  "components, and other parts will be ignored. Set the baseUrl instead",
                  qUtf16Printable(providedPath.toDisplayString()));
    }

    QUrl resultUrl = baseUrl;
    QUrlQuery resultQuery(providedQuery);
    QString basePath = baseUrl.path();

    resultUrl.setUserName(userName);
    resultUrl.setPassword(password);

    // Separate the path and query parameters components on the application-provided path
    const QString requestPath{providedPath.path()};
    const QUrlQuery pathQueryItems{providedPath};

    if (!pathQueryItems.isEmpty()) {
        // Add any query items provided as part of the path
        const auto items = pathQueryItems.queryItems(QUrl::ComponentFormattingOption::FullyEncoded);
        for (const auto &[key, value]: items)
            resultQuery.addQueryItem(key, value);
    }

    if (!queryParameters.isEmpty()) {
        // Add any query items set to this factory
        const QList<std::pair<QString,QString>> items =
                queryParameters.queryItems(QUrl::ComponentFormattingOption::FullyEncoded);
        for (const auto &item: items)
            resultQuery.addQueryItem(item.first, item.second);
    }

    if (!resultQuery.isEmpty())
        resultUrl.setQuery(resultQuery);

    if (requestPath.isEmpty())
        return resultUrl;

    // Ensure that the "base path" (the path that may be present
    // in the baseUrl), and the request path are joined with one '/'
    // If both have it, remove one, if neither has it, add one
    if (basePath.endsWith(u'/') && requestPath.startsWith(u'/'))
        basePath.chop(1);
    else if (!requestPath.startsWith(u'/') && !basePath.endsWith(u'/'))
        basePath.append(u'/');

    resultUrl.setPath(basePath.append(requestPath));
    return resultUrl;
}